

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

void despot::DESPOT::Update(QNode *qnode)

{
  VNode *this;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *pmVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  double dVar3;
  double local_38;
  double local_30;
  double local_28;
  
  local_38 = qnode->step_reward;
  local_28 = DAT_0019fde0 + local_38;
  pmVar1 = QNode::children(qnode);
  local_30 = local_38;
  for (p_Var2 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    this = (VNode *)p_Var2[1]._M_parent;
    dVar3 = VNode::lower_bound(this);
    local_30 = local_30 + dVar3;
    dVar3 = VNode::upper_bound(this);
    local_38 = local_38 + dVar3;
    local_28 = local_28 + this->utility_upper_bound;
  }
  dVar3 = QNode::lower_bound(qnode);
  if (dVar3 < local_30) {
    QNode::lower_bound(qnode,local_30);
  }
  dVar3 = QNode::upper_bound(qnode);
  if (local_38 < dVar3) {
    QNode::upper_bound(qnode,local_38);
  }
  if (local_28 < qnode->utility_upper_bound) {
    qnode->utility_upper_bound = local_28;
  }
  return;
}

Assistant:

void DESPOT::Update(QNode* qnode) {
	double lower = qnode->step_reward;
	double upper = qnode->step_reward;
	double utility_upper = qnode->step_reward
		+ Globals::config.pruning_constant;

	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
		it != children.end(); it++) {
		VNode* vnode = it->second;

		lower += vnode->lower_bound();
		upper += vnode->upper_bound();
		utility_upper += vnode->utility_upper_bound;
	}

	if (lower > qnode->lower_bound()) {
		qnode->lower_bound(lower);
	}
	if (upper < qnode->upper_bound()) {
		qnode->upper_bound(upper);
	}
	if (utility_upper < qnode->utility_upper_bound) {
		qnode->utility_upper_bound = utility_upper;
	}
}